

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderError3InputBlocks::getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError3InputBlocks *this,
          uint n_program_object)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices=4) out;\n\nout IN_TE\n{\n    vec4 test_block_field;\n} test_block[];\n\nvoid main()\n{\n    gl_out           [gl_InvocationID].gl_Position      = gl_in[gl_InvocationID].gl_Position;\n    test_block       [gl_InvocationID].test_block_field = vec4(2.0);\n    gl_TessLevelOuter[0]                                = 1.0;\n    gl_TessLevelOuter[1]                                = 1.0;\n    gl_TessLevelOuter[2]                                = 1.0;\n    gl_TessLevelOuter[3]                                = 1.0;\n    gl_TessLevelInner[0]                                = 1.0;\n    gl_TessLevelInner[1]                                = 1.0;\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError3InputBlocks::getTessellationControlShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout (vertices=4) out;\n"
		   "\n"
		   "out IN_TE\n"
		   "{\n"
		   "    vec4 test_block_field;\n"
		   "} test_block[];\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_out           [gl_InvocationID].gl_Position      = gl_in[gl_InvocationID].gl_Position;\n"
		   "    test_block       [gl_InvocationID].test_block_field = vec4(2.0);\n"
		   "    gl_TessLevelOuter[0]                                = 1.0;\n"
		   "    gl_TessLevelOuter[1]                                = 1.0;\n"
		   "    gl_TessLevelOuter[2]                                = 1.0;\n"
		   "    gl_TessLevelOuter[3]                                = 1.0;\n"
		   "    gl_TessLevelInner[0]                                = 1.0;\n"
		   "    gl_TessLevelInner[1]                                = 1.0;\n"
		   "}\n";
}